

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyDropComments(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  Node *pNVar2;
  
  while (node != (Node *)0x0) {
    pNVar2 = node->next;
    if (node->type == CommentTag) {
      prvTidyRemoveNode(node);
      prvTidyFreeNode(doc,node);
      node = pNVar2;
    }
    else {
      ppNVar1 = &node->content;
      node = pNVar2;
      if (*ppNVar1 != (Node *)0x0) {
        prvTidyDropComments(doc,*ppNVar1);
      }
    }
  }
  return;
}

Assistant:

void TY_(DropComments)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->type == CommentTag)
        {
            TY_(RemoveNode)(node);
            TY_(FreeNode)(doc, node);
            node = next;
            continue;
        }

        if (node->content)
            TY_(DropComments)(doc, node->content);

        node = next;
    }
}